

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O2

bool duckdb_re2::RegexSearchInternal
               (char *input_data,size_t input_size,Match *match,RE2 *regex,Anchor anchor,
               size_t start,size_t end)

{
  pointer pSVar1;
  bool bVar2;
  size_type __new_size;
  pointer this;
  vector<duckdb_re2::StringPiece,_true> target_groups;
  GroupMatch group_match;
  _Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_> local_98;
  size_t local_80;
  GroupMatch local_78;
  string local_50;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (StringPiece *)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (StringPiece *)0x0;
  __new_size = (long)regex->num_captures_ + 1;
  local_80 = start;
  duckdb::std::vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>::resize
            ((vector<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_> *)&local_98,
             __new_size);
  duckdb::std::vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_>::clear
            ((vector<duckdb_re2::GroupMatch,_std::allocator<duckdb_re2::GroupMatch>_> *)match);
  local_78.text._M_dataplus._M_p = input_data;
  local_78.text._M_string_length = input_size;
  bVar2 = RE2::Match(regex,(StringPiece *)&local_78,local_80,end,anchor,
                     local_98._M_impl.super__Vector_impl_data._M_start,(int)__new_size);
  pSVar1 = local_98._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    for (this = local_98._M_impl.super__Vector_impl_data._M_start; this != pSVar1; this = this + 1)
    {
      local_78.text._M_dataplus._M_p = (pointer)&local_78.text.field_2;
      local_78.text._M_string_length = 0;
      local_78.text.field_2._M_local_buf[0] = '\0';
      StringPiece::ToString_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (this->data_ == (const_pointer)0x0) {
        local_78.position = 0;
      }
      else {
        local_78.position =
             duckdb::NumericCastImpl<unsigned_int,_long,_false>::Convert
                       ((long)this->data_ - (long)input_data);
      }
      std::vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>>::
      emplace_back<duckdb_re2::GroupMatch&>
                ((vector<duckdb_re2::GroupMatch,std::allocator<duckdb_re2::GroupMatch>> *)match,
                 &local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  duckdb::std::_Vector_base<duckdb_re2::StringPiece,_std::allocator<duckdb_re2::StringPiece>_>::
  ~_Vector_base(&local_98);
  return bVar2;
}

Assistant:

bool RegexSearchInternal(const char *input_data, size_t input_size, Match &match, const RE2 &regex, RE2::Anchor anchor,
                         size_t start, size_t end) {
	duckdb::vector<StringPiece> target_groups;
	auto group_count = duckdb::UnsafeNumericCast<size_t>(regex.NumberOfCapturingGroups() + 1);
	target_groups.resize(group_count);
	match.groups.clear();
	if (!regex.Match(StringPiece(input_data, input_size), start, end, anchor, target_groups.data(),
	                 duckdb::UnsafeNumericCast<int>(group_count))) {
		return false;
	}
	for (auto &group : target_groups) {
		GroupMatch group_match;
		group_match.text = group.ToString();
		group_match.position = group.data() != nullptr ? duckdb::NumericCast<uint32_t>(group.data() - input_data) : 0;
		match.groups.emplace_back(group_match);
	}
	return true;
}